

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  bool bVar1;
  uint index;
  StringEntry *__tmp;
  StringEntry *pSVar2;
  StringEntry *pSVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  long *plVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  pointer buf;
  int i_1;
  ulong uVar10;
  StringEntry **ppSVar11;
  string *psVar12;
  bool bVar13;
  value_type local_2d1;
  string *local_2d0;
  StringEntry *se [2];
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long entryBegin [3];
  unsigned_long entryEnd [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  zeroPosition[0] = 0;
  zeroPosition[1] = 0;
  zeroSize[0] = 0;
  zeroSize[1] = 0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmELF::cmELF((cmELF *)&f,(file->_M_dataplus)._M_p);
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  pSVar2 = cmELF::GetRPath((cmELF *)&f);
  if (pSVar2 == (StringEntry *)0x0) {
    ppSVar11 = se;
  }
  else {
    ppSVar11 = se + 1;
    se[0] = pSVar2;
  }
  local_2d0 = emsg;
  pSVar3 = cmELF::GetRunPath((cmELF *)&f);
  psVar12 = local_2d0;
  puVar9 = entryBegin + 1;
  uVar10 = 1;
  if (pSVar3 == (StringEntry *)0x0) {
    if (pSVar2 != (StringEntry *)0x0) goto LAB_002b9265;
    bVar1 = true;
  }
  else {
    *ppSVar11 = pSVar3;
    pSVar3 = se[0];
    if (pSVar2 != (StringEntry *)0x0) {
      puVar9 = entryBegin + 2;
      uVar10 = 2;
      if (se[1]->IndexInSection < se[0]->IndexInSection) {
        se[0] = se[1];
        se[1] = pSVar3;
      }
    }
LAB_002b9265:
    index = cmELF::GetDynamicEntryCount((cmELF *)&f);
    if (index != 0) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        zeroPosition[uVar4] = se[uVar4]->Position;
        zeroSize[uVar4] = se[uVar4]->Size;
      }
      entryBegin[2] = 0;
      entryBegin[0] = 0;
      entryBegin[1] = 0;
      entryEnd[0] = 0;
      entryEnd[1] = 0;
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        pSVar2 = se[uVar4];
        uVar5 = cmELF::GetDynamicEntryPosition((cmELF *)&f,pSVar2->IndexInSection);
        entryBegin[uVar4] = uVar5;
        uVar5 = cmELF::GetDynamicEntryPosition((cmELF *)&f,pSVar2->IndexInSection + 1);
        entryEnd[uVar4] = uVar5;
      }
      uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)&f,index);
      uVar5 = entryBegin[0];
      *puVar9 = uVar6;
      local_2d1 = '\0';
      std::vector<char,_std::allocator<char>_>::resize(&bytes,uVar6 - entryBegin[0],&local_2d1);
      buf = bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start;
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        uVar6 = entryBegin[uVar4 + 1] - entryEnd[uVar4];
        if ((uVar6 != 0) &&
           (bVar1 = cmELF::ReadBytes((cmELF *)&f,entryEnd[uVar4],uVar6,buf), psVar12 = local_2d0,
           !bVar1)) {
          bVar13 = uVar10 <= uVar4;
          if (local_2d0 != (string *)0x0) {
            std::__cxx11::string::assign((char *)local_2d0);
          }
          goto LAB_002b93a4;
        }
        buf = buf + uVar6;
      }
      bVar13 = true;
      psVar12 = local_2d0;
LAB_002b93a4:
      bVar1 = false;
      goto LAB_002b93b4;
    }
    if (psVar12 != (string *)0x0) {
      std::__cxx11::string::assign((char *)psVar12);
    }
    bVar1 = false;
  }
  bVar13 = false;
  uVar5 = 0;
  uVar10 = 0;
LAB_002b93b4:
  cmELF::~cmELF((cmELF *)&f);
  if (bVar13) {
    std::ofstream::ofstream(&f,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    if (((((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
          == 0) &&
        (plVar7 = (long *)std::ostream::seekp(&f,uVar5,0),
        (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0)) &&
       (plVar7 = (long *)std::ostream::write((char *)&f,
                                             (long)bytes.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
       (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0)) {
      uVar4 = 0;
      do {
        uVar8 = uVar4;
        if (uVar8 == uVar10) {
          bVar13 = false;
          goto LAB_002b9555;
        }
        plVar7 = (long *)std::ostream::seekp(&f,zeroPosition[uVar8],0);
        if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
          if (local_2d0 != (string *)0x0) {
            std::__cxx11::string::assign((char *)local_2d0);
          }
          goto LAB_002b946f;
        }
        uVar5 = zeroSize[uVar8];
        while (bVar13 = uVar5 != 0, uVar5 = uVar5 - 1, bVar13) {
          std::operator<<(&f.super_basic_ostream<char,_std::char_traits<char>_>,'\0');
        }
        uVar4 = uVar8 + 1;
      } while (((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
                [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]]
               & 5) == 0);
      bVar13 = uVar8 < uVar10;
      if (local_2d0 == (string *)0x0) {
        bVar1 = false;
      }
      else {
        std::__cxx11::string::assign((char *)local_2d0);
        bVar1 = false;
      }
LAB_002b9555:
      if (removed == (bool *)0x0 || bVar13 != false) {
        bVar1 = (bool)(bVar1 | bVar13 ^ 1U);
      }
      else {
        *removed = true;
        bVar1 = true;
      }
    }
    else {
      if (psVar12 != (string *)0x0) {
        std::__cxx11::string::assign((char *)psVar12);
      }
LAB_002b946f:
      bVar1 = false;
    }
    std::ofstream::~ofstream(&f);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&bytes.super__Vector_base<char,_std::allocator<char>_>);
  return bVar1;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(removed)
    {
    *removed = false;
    }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = {0,0};
  unsigned long zeroSize[2] = {0,0};
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it and sort them by index
  // in the dynamic section header.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count++] = se_rpath;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count++] = se_runpath;
    }
  if(se_count == 0)
    {
    // There is no RPATH or RUNPATH anyway.
    return true;
    }
  if(se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection)
    {
    std::swap(se[0], se[1]);
    }

  // Get the size of the dynamic section header.
  unsigned int count = elf.GetDynamicEntryCount();
  if(count == 0)
    {
    // This should happen only for invalid ELF files where a DT_NULL
    // appears before the end of the table.
    if(emsg)
      {
      *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
    return false;
    }

  // Save information about the string entries to be zeroed.
  zeroCount = se_count;
  for(int i=0; i < se_count; ++i)
    {
    zeroPosition[i] = se[i]->Position;
    zeroSize[i] = se[i]->Size;
    }

  // Get the range of file positions corresponding to each entry and
  // the rest of the table after them.
  unsigned long entryBegin[3] = {0,0,0};
  unsigned long entryEnd[2] = {0,0};
  for(int i=0; i < se_count; ++i)
    {
    entryBegin[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection);
    entryEnd[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection+1);
    }
  entryBegin[se_count] = elf.GetDynamicEntryPosition(count);

  // The data are to be written over the old table entries starting at
  // the first one being removed.
  bytesBegin = entryBegin[0];
  unsigned long bytesEnd = entryBegin[se_count];

  // Allocate a buffer to hold the part of the file to be written.
  // Initialize it with zeros.
  bytes.resize(bytesEnd - bytesBegin, 0);

  // Read the part of the DYNAMIC section header that will move.
  // The remainder of the buffer will be left with zeros which
  // represent a DT_NULL entry.
  char* data = &bytes[0];
  for(int i=0; i < se_count; ++i)
    {
    // Read data between the entries being removed.
    unsigned long sz = entryBegin[i+1] - entryEnd[i];
    if(sz > 0 && !elf.ReadBytes(entryEnd[i], sz, data))
      {
      if(emsg)
        {
        *emsg = "Failed to read DYNAMIC section header.";
        }
      return false;
      }
    data += sz;
    }
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Write the new DYNAMIC table header.
  if(!f.seekp(bytesBegin))
    {
    if(emsg)
      {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
      }
    return false;
    }
  if(!f.write(&bytes[0], bytes.size()))
    {
    if(emsg)
      {
      *emsg = "Error replacing DYNAMIC table header.";
      }
    return false;
    }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for(int i=0; i < zeroCount; ++i)
    {
    if(!f.seekp(zeroPosition[i]))
      {
      if(emsg)
        {
        *emsg = "Error seeking to RPATH position.";
        }
      return false;
      }
    for(unsigned long j=0; j < zeroSize[i]; ++j)
      {
      f << '\0';
      }
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the empty rpath string to the file.";
        }
      return false;
      }
    }

  // Everything was updated successfully.
  if(removed)
    {
    *removed = true;
    }
  return true;
#else
  (void)file;
  (void)emsg;
  (void)removed;
  return false;
#endif
}